

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O1

void sshproxy_close(Socket *s)

{
  sk_addr_free((SockAddr *)s[-2].vt);
  safefree(s[-0x414].vt);
  conf_free((Conf *)s[-0x413].vt);
  if (s[-0x411].vt != (SocketVtable *)0x0) {
    (**(code **)((s[-0x411].vt)->plug + 8))();
  }
  if ((LogContext *)s[-0x412].vt != (LogContext *)0x0) {
    log_free((LogContext *)s[-0x412].vt);
  }
  if (s[-0x40c].vt != (SocketVtable *)0x0) {
    burnstr((char *)s[-0x40c].vt);
  }
  bufchain_clear((bufchain *)(s + -8));
  delete_callbacks_for_context(s + -0x414);
  safefree(s + -0x414);
  return;
}

Assistant:

static void sshproxy_close(Socket *s)
{
    SshProxy *sp = container_of(s, SshProxy, sock);

    sk_addr_free(sp->addr);
    sfree(sp->errmsg);
    conf_free(sp->conf);
    if (sp->backend)
        backend_free(sp->backend);
    if (sp->logctx)
        log_free(sp->logctx);
    if (sp->proxy_password)
        burnstr(sp->proxy_password);
    bufchain_clear(&sp->ssh_to_socket);

    delete_callbacks_for_context(sp);
    sfree(sp);
}